

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

Material * __thiscall Assimp::D3DS::Material::operator=(Material *this,Material *other)

{
  ai_real aVar1;
  Material *other_local;
  Material *this_local;
  
  std::__cxx11::string::operator=((string *)&this->mName,(string *)&other->mName);
  aiColor3D::operator=(&this->mDiffuse,&other->mDiffuse);
  aVar1 = other->mShininessStrength;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = aVar1;
  aiColor3D::operator=(&this->mSpecular,&other->mSpecular);
  aiColor3D::operator=(&this->mAmbient,&other->mAmbient);
  aVar1 = other->mTransparency;
  this->mShading = other->mShading;
  this->mTransparency = aVar1;
  D3DS::Texture::operator=(&this->sTexDiffuse,&other->sTexDiffuse);
  D3DS::Texture::operator=(&this->sTexOpacity,&other->sTexOpacity);
  D3DS::Texture::operator=(&this->sTexSpecular,&other->sTexSpecular);
  D3DS::Texture::operator=(&this->sTexReflective,&other->sTexReflective);
  D3DS::Texture::operator=(&this->sTexBump,&other->sTexBump);
  D3DS::Texture::operator=(&this->sTexEmissive,&other->sTexEmissive);
  D3DS::Texture::operator=(&this->sTexShininess,&other->sTexShininess);
  this->mBumpHeight = other->mBumpHeight;
  aiColor3D::operator=(&this->mEmissive,&other->mEmissive);
  D3DS::Texture::operator=(&this->sTexAmbient,&other->sTexAmbient);
  this->mTwoSided = (bool)(other->mTwoSided & 1);
  return this;
}

Assistant:

Material &operator=(const Material &other) = default;